

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

xchar ledger_to_dnum(xchar ledgerno)

{
  ulong uVar1;
  xchar *pxVar2;
  ulong uVar3;
  int iVar4;
  undefined7 in_register_00000039;
  
  uVar3 = 0;
  uVar1 = (ulong)(uint)n_dgns;
  if (n_dgns < 1) {
    uVar1 = uVar3;
  }
  pxVar2 = &dungeons[0].num_dunlevs;
  while( true ) {
    if (uVar1 == uVar3) {
      panic("level number out of range [ledger_to_dnum(%d)]");
    }
    iVar4 = (int)CONCAT71(in_register_00000039,ledgerno);
    if ((*(int *)(pxVar2 + 3) < iVar4) && (iVar4 <= *(int *)(pxVar2 + 3) + (int)*pxVar2)) break;
    uVar3 = uVar3 + 1;
    pxVar2 = pxVar2 + 0x38;
  }
  return (xchar)uVar3;
}

Assistant:

xchar ledger_to_dnum(xchar ledgerno)
{
	int i;

	/* find i such that (i->base + 1) <= ledgerno <= (i->base + i->count) */
	for (i = 0; i < n_dgns; i++)
	    if (dungeons[i].ledger_start < ledgerno &&
		ledgerno <= dungeons[i].ledger_start + dungeons[i].num_dunlevs)
		return (xchar)i;

	panic("level number out of range [ledger_to_dnum(%d)]", (int)ledgerno);
	/*NOT REACHED*/
	return (xchar)0;
}